

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_decimal128.hpp
# Opt level: O3

decimal128_to_chars_result
jsoncons::bson::decimal128_to_chars(char *first,char *last,decimal128_t *dec)

{
  uint uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 auVar3 [16];
  int iVar4;
  ulong uVar5;
  size_type sVar6;
  ulong uVar7;
  int iVar8;
  undefined4 uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  undefined1 *puVar14;
  int iVar15;
  uint uVar16;
  long lVar18;
  int *__s;
  char *pcVar19;
  char *pcVar20;
  bool bVar21;
  decimal128_to_chars_result dVar22;
  string s;
  string bson_decimal128_nan;
  string bson_decimal128_inf;
  uint32_t significand [36];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  long *local_110;
  size_t local_108;
  long local_100 [2];
  long *local_f0;
  size_t local_e8;
  long local_e0 [2];
  ulong local_d0;
  int local_c8;
  int local_c4 [34];
  undefined1 local_3c [12];
  _Alloc_hider _Var17;
  
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Infinity","");
  local_110 = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"NaN","");
  __s = &local_c8;
  memset(__s,0,0x90);
  uVar7 = dec->high;
  pcVar19 = first;
  if ((long)uVar7 < 0) {
    pcVar19 = first + 1;
    *first = '-';
    uVar7 = dec->high;
  }
  uVar5 = dec->low;
  uVar16 = (uint)(uVar7 >> 0x20);
  if ((~uVar16 & 0x60000000) == 0) {
    uVar11 = uVar16 >> 0x1a & 0x1f;
    if (uVar11 == 0x1f) {
      if ((long)local_108 <= (long)last - (long)first) {
        memcpy(first,local_110,local_108);
        first = first + local_108;
      }
      *first = '\0';
      uVar9 = 0;
      goto LAB_001f451c;
    }
    if (uVar11 == 0x1e) {
      first = pcVar19;
      if ((long)local_e8 <= (long)last - (long)pcVar19) {
        memcpy(pcVar19,local_f0,local_e8);
        first = pcVar19 + local_e8;
      }
      *first = '\0';
      uVar9 = 0;
      goto LAB_001f451c;
    }
    uVar11 = uVar16 >> 0xf;
    uVar12 = uVar16 >> 0xe & 1 | 8;
  }
  else {
    uVar12 = uVar16 >> 0xe & 7;
    uVar11 = uVar16 >> 0x11;
  }
  uVar11 = uVar11 & 0x3fff;
  uVar1 = uVar11 - 0x1820;
  uVar16 = uVar12 << 0xe | uVar16 & 0x3fff;
  _Var17._M_p = (pointer)(ulong)uVar16;
  sVar6 = uVar5 << 0x20 | uVar5 >> 0x20;
  if ((uVar12 < 8) &&
     ((int)uVar5 != 0 || (((int)(uVar5 >> 0x20) != 0 || (int)uVar7 != 0) || uVar16 != 0))) {
    lVar13 = 3;
    puVar14 = local_3c;
    do {
      local_130._M_dataplus._M_p = (pointer)((ulong)_Var17._M_p & 0xffffffff | uVar7 << 0x20);
      local_130._M_string_length = sVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0 && sVar6 == 0) {
        uVar7 = 0;
        sVar6 = 0;
        _Var17._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)0x0;
      }
      else {
        lVar18 = 0;
        uVar5 = 0;
        do {
          uVar5 = uVar5 << 0x20 | (ulong)*(uint *)((long)&local_130._M_dataplus._M_p + lVar18 * 4);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar5;
          uVar7 = SUB168(auVar3 * ZEXT816(0x112e0be826d694b3),8) >> 0x1a;
          *(int *)((long)&local_130._M_dataplus._M_p + lVar18 * 4) = (int)uVar7;
          uVar5 = uVar5 + uVar7 * -1000000000;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 4);
        uVar7 = (ulong)local_130._M_dataplus._M_p >> 0x20;
        sVar6 = local_130._M_string_length;
        _Var17._M_p = local_130._M_dataplus._M_p;
        if (uVar5 != 0) {
          lVar18 = 0;
          do {
            iVar15 = (int)uVar5;
            uVar10 = uVar5 & 0xffffffff;
            uVar5 = uVar10 / 10;
            *(int *)(puVar14 + lVar18 * 4) = iVar15 + (int)(uVar10 / 10) * -10;
            lVar18 = lVar18 + -1;
          } while (lVar18 != -9);
        }
      }
      puVar14 = puVar14 + -0x24;
      bVar21 = lVar13 != 0;
      lVar13 = lVar13 + -1;
    } while (bVar21);
    uVar16 = 0x24;
    iVar15 = local_c8;
    local_d0 = (ulong)uVar1;
    if (local_c8 == 0) {
      uVar16 = 0x24;
      __s = &local_c8;
      do {
        uVar16 = uVar16 - 1;
        iVar15 = __s[1];
        __s = __s + 1;
      } while (iVar15 == 0);
    }
  }
  else {
    local_c8 = 0;
    uVar16 = 1;
    iVar15 = 0;
  }
  iVar8 = uVar16 + uVar1 + -1;
  if ((0x1820 < uVar11) || (iVar8 < -6)) {
    *pcVar19 = (char)iVar15 + '0';
    if (uVar16 - 1 == 0) {
      pcVar20 = pcVar19 + 1;
    }
    else {
      pcVar20 = pcVar19 + 2;
      pcVar19[1] = '.';
      if ((long)pcVar20 - (long)first < 0x24) {
        uVar7 = 0;
        do {
          pcVar20[uVar7] = (char)__s[uVar7 + 1] + '0';
          uVar5 = uVar7 + 1;
          if (uVar16 - 1 <= uVar5) break;
          lVar13 = uVar7 + (3 - (long)first);
          uVar7 = uVar5;
        } while ((long)(pcVar19 + lVar13) < 0x24);
        pcVar20 = pcVar20 + uVar5;
      }
    }
    *pcVar20 = 'E';
    paVar2 = &local_130.field_2;
    local_130._M_string_length = 0;
    local_130.field_2._M_local_buf[0] = '\0';
    local_130._M_dataplus._M_p = (pointer)paVar2;
    if (-1 < iVar8) {
      std::__cxx11::string::push_back((char)&local_130);
    }
    jsoncons::detail::from_integer<int,std::__cxx11::string>(iVar8,&local_130);
    first = pcVar20 + 1;
    pcVar19 = first + local_130._M_string_length;
    if (pcVar19 < last) {
      memcpy(first,local_130._M_dataplus._M_p,local_130._M_string_length);
      first = first + local_130._M_string_length;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar2) {
      operator_delete(local_130._M_dataplus._M_p,
                      CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                               local_130.field_2._M_local_buf[0]) + 1);
    }
    uVar9 = 0x4b;
    if (pcVar19 < last) {
      uVar9 = 0;
    }
    goto LAB_001f451c;
  }
  if (uVar11 < 0x1820) {
    iVar15 = uVar1 + uVar16;
    if (iVar15 < 1) {
      *pcVar19 = '0';
      pcVar20 = pcVar19 + 1;
LAB_001f4497:
      *pcVar20 = '.';
      pcVar19 = pcVar20 + 1;
      if (iVar15 < 0) {
        uVar7 = (ulong)(0x181f - (uVar11 + uVar16));
        memset(pcVar19,0x30,uVar7 + 1);
        pcVar19 = pcVar20 + uVar7 + 2;
        iVar15 = 0;
      }
    }
    else {
      if (pcVar19 < last) {
        iVar8 = 1;
        pcVar20 = pcVar19;
        do {
          iVar4 = *__s;
          __s = __s + 1;
          *pcVar20 = (char)iVar4 + '0';
          pcVar20 = pcVar20 + 1;
          if (iVar15 <= iVar8) break;
          iVar8 = iVar8 + 1;
        } while (pcVar20 < last);
        goto LAB_001f4497;
      }
      *pcVar19 = '.';
      pcVar19 = pcVar19 + 1;
    }
    if ((uVar16 - iVar15 != 0) && (pcVar19 < last)) {
      uVar7 = 1;
      do {
        uVar5 = uVar7;
        pcVar19[uVar5 - 1] = (char)__s[uVar5 - 1] + '0';
        if (uVar16 - iVar15 <= uVar5) break;
        uVar7 = uVar5 + 1;
      } while (pcVar19 + uVar5 < last);
      pcVar19 = pcVar19 + uVar5;
    }
  }
  else if ((long)pcVar19 - (long)first < 0x24 && uVar16 != 0) {
    uVar7 = 0;
    do {
      pcVar19[uVar7] = (char)__s[uVar7] + '0';
      uVar5 = uVar7 + 1;
      if (uVar16 <= uVar5) break;
      lVar13 = uVar7 + ((long)pcVar19 - (long)first) + 1;
      uVar7 = uVar5;
    } while (lVar13 < 0x24);
    pcVar19 = pcVar19 + uVar5;
  }
  uVar9 = 0;
  first = pcVar19;
LAB_001f451c:
  if (local_110 != local_100) {
    operator_delete(local_110,local_100[0] + 1);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  dVar22.ec = uVar9;
  dVar22.ptr = first;
  dVar22._12_4_ = 0;
  return dVar22;
}

Assistant:

inline
    decimal128_to_chars_result decimal128_to_chars(char* first, char* last, const decimal128_t& dec)
    {
        const std::string bson_decimal128_inf = "Infinity";
        const std::string bson_decimal128_nan = "NaN";

        const uint32_t combination_mask = 0x1f;   /* Extract least significant 5 bits */
        const uint32_t exponent_mask = 0x3fff;    /* Extract least significant 14 bits */
        const uint32_t combination_infinity = 30; /* Value of combination field for Inf */
        const uint32_t combination_nan = 31;      /* Value of combination field for NaN */
        const uint32_t exponent_bias = 6176;      /* decimal128 exponent bias */

        char* str_out = first;      /* output pointer in string */
        char significand_str[35]; /* decoded significand digits */

        /* Note: bits in this routine are referred to starting at 0, */
        /* from the sign bit, towards the coefficient. */
        uint32_t high;                   /* bits 0 - 31 */
        uint32_t midh;                   /* bits 32 - 63 */
        uint32_t midl;                   /* bits 64 - 95 */
        uint32_t low;                    /* bits 96 - 127 */
        uint32_t combination;            /* bits 1 - 5 */
        uint32_t biased_exponent;        /* decoded biased exponent (14 bits) */
        uint32_t significand_digits = 0; /* the number of significand digits */
        uint32_t significand[36] = {0};  /* the base-10 digits in the significand */
        uint32_t *significand_read = significand; /* read pointer into significand */
        int32_t exponent;                         /* unbiased exponent */
        int32_t scientific_exponent; /* the exponent if scientific notation is
                                      * used */
        bool is_zero = false;        /* true if the number is zero */
 
        uint8_t significand_msb; /* the most signifcant significand bits (50-46) */
        bson_uint128_t
           significand128; /* temporary storage for significand decoding */
 
        memset (significand_str, 0, sizeof (significand_str));
 
        if ((int64_t) dec.high < 0) { /* negative */
           *(str_out++) = '-';
        }
 
        low = (uint32_t) dec.low, midl = (uint32_t) (dec.low >> 32),
        midh = (uint32_t) dec.high, high = (uint32_t) (dec.high >> 32);
 
        /* Decode combination field and exponent */
        combination = (high >> 26) & combination_mask;
 
        if (JSONCONS_UNLIKELY ((combination >> 3) == 3)) {
           /* Check for 'special' values */
           if (combination == combination_infinity) { /* Infinity */
               if (last-str_out >= static_cast<ptrdiff_t >(bson_decimal128_inf.size())) 
               {
                   std::memcpy(str_out, bson_decimal128_inf.data(), bson_decimal128_inf.size());
                   str_out += bson_decimal128_inf.size();
               }
               *str_out = 0;
              //strcpy_s (str_out, last-str_out, bson_decimal128_inf.c_str());
              return decimal128_to_chars_result{str_out, std::errc()};
           } else if (combination == combination_nan) { /* NaN */
               /* first, not str_out, to erase the sign */
               str_out = first;
               if (last-str_out >= static_cast<ptrdiff_t >(bson_decimal128_nan.size())) 
               {
                   std::memcpy(str_out, bson_decimal128_nan.data(), bson_decimal128_nan.size());
                   str_out += bson_decimal128_nan.size();
               }
               *str_out = 0;
              //strcpy_s (first, last-first, bson_decimal128_nan.c_str());
              /* we don't care about the NaN payload. */
               return decimal128_to_chars_result{str_out, std::errc()};
           } else {
              biased_exponent = (high >> 15) & exponent_mask;
              significand_msb = 0x8 + ((high >> 14) & 0x1);
           }
        } else {
           significand_msb = (high >> 14) & 0x7;
           biased_exponent = (high >> 17) & exponent_mask;
        }
 
        exponent = biased_exponent - exponent_bias;
        /* Create string of significand digits */
 
        /* Convert the 114-bit binary number represented by */
        /* (high, midh, midl, low) to at most 34 decimal */
        /* digits through modulo and division. */
        significand128.parts[0] = (high & 0x3fff) + ((significand_msb & 0xf) << 14);
        significand128.parts[1] = midh;
        significand128.parts[2] = midl;
        significand128.parts[3] = low;
 
        if (significand128.parts[0] == 0 && significand128.parts[1] == 0 &&
            significand128.parts[2] == 0 && significand128.parts[3] == 0) {
           is_zero = true;
        } else if (significand128.parts[0] >= (1 << 17)) {
           /* The significand is non-canonical or zero.
            * In order to preserve compatibility with the densely packed decimal
            * format, the maximum value for the significand of decimal128 is
            * 1e34 - 1.  If the value is greater than 1e34 - 1, the IEEE 754
            * standard dictates that the significand is interpreted as zero.
            */
           is_zero = true;
        } else {
           for (int k = 3; k >= 0; k--) {
              uint32_t least_digits = 0;
              detail::bson_uint128_divide1B (
                 significand128, &significand128, &least_digits);
 
              /* We now have the 9 least significant digits (in base 2). */
              /* Convert and output to string. */
              if (!least_digits) {
                 continue;
              }
 
              for (int j = 8; j >= 0; j--) {
                 significand[k * 9 + j] = least_digits % 10;
                 least_digits /= 10;
              }
           }
        }
 
        /* Output format options: */
        /* Scientific - [-]d.dddE(+/-)dd or [-]dE(+/-)dd */
        /* Regular    - ddd.ddd */
 
        if (is_zero) {
           significand_digits = 1;
           *significand_read = 0;
        } else {
           significand_digits = 36;
           while (!(*significand_read)) {
              significand_digits--;
              significand_read++;
           }
        }
 
        scientific_exponent = significand_digits - 1 + exponent;
 
        /* The scientific exponent checks are dictated by the string conversion
         * specification and are somewhat arbitrary cutoffs.
         *
         * We must check exponent > 0, because if this is the case, the number
         * has trailing zeros.  However, we *cannot* output these trailing zeros,
         * because doing so would change the precision of the value, and would
         * change stored data if the string converted number is round tripped.
         */
        if (scientific_exponent < -6 || exponent > 0) {
           /* Scientific format */
           *(str_out++) = char(*(significand_read++)) + '0';
           significand_digits--;
 
           if (significand_digits) {
              *(str_out++) = '.';
           }
 
           for (std::size_t i = 0; i < significand_digits && (str_out - first) < 36; i++) {
              *(str_out++) = char(*(significand_read++)) + '0';
           }
           /* Exponent */
           *(str_out++) = 'E';

           std::string s;
           if (scientific_exponent >= 0) {
               s.push_back('+');
           }
           jsoncons::detail::from_integer(scientific_exponent, s);
           if (str_out + s.size() < last) 
           {
               std::memcpy(str_out, s.data(), s.size());
           }
           else
           {
               return decimal128_to_chars_result{str_out, std::errc::value_too_large};
           }
           str_out += s.size();
        } else {
           /* Regular format with no decimal place */
           if (exponent >= 0) {
              for (std::size_t i = 0; i < significand_digits && (str_out - first) < 36; i++) {
                 *(str_out++) = char(*(significand_read++)) + '0';
              }
           } else {
              int32_t radix_position = significand_digits + exponent;
 
              if (radix_position > 0) { /* non-zero digits before radix */
                 for (int32_t i = 0;
                      i < radix_position && (str_out < last);
                      i++) {
                    *(str_out++) = char(*(significand_read++)) + '0';
                 }
              } else { /* leading zero before radix point */
                 *(str_out++) = '0';
              }
 
              *(str_out++) = '.';
              while (radix_position++ < 0) { /* add leading zeros after radix */
                 *(str_out++) = '0';
              }
 
              for (std::size_t i = 0;
                   (i < significand_digits - (std::max) (radix_position - 1, 0)) &&
                   (str_out < last);
                   i++) {
                 *(str_out++) = char(*(significand_read++)) + '0';
              }
           }
        }
        return decimal128_to_chars_result{str_out, std::errc()};
    }